

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O3

int __thiscall sparse_tree::b(sparse_tree *this,int i,int l)

{
  pointer pNVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  pNVar1 = (this->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = (pNVar1[l].parent)->index;
  iVar3 = -2;
  if ((((iVar2 != 0) && (pNVar1[l].pair < 0)) && (iVar3 = -1, i <= iVar2)) &&
     (iVar2 = LCA(this,i,l), iVar3 = i, iVar2 != i)) {
    for (piVar4 = *(int **)&pNVar1[iVar2].children.super__Vector_base<int,_std::allocator<int>_>;
        piVar4 != *(pointer *)
                   ((long)&pNVar1[iVar2].children.super__Vector_base<int,_std::allocator<int>_> + 8)
        ; piVar4 = piVar4 + 1) {
      iVar3 = *piVar4;
      if ((iVar3 < l) && (l < pNVar1[iVar3].pair)) {
        return iVar3;
      }
    }
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

const int sparse_tree::b(int i, int l) const{
    if(tree[l].parent->index == 0 || tree[l].pair > -1) return -2;
    if ((tree[l].parent)->index < i) return -1;
    else{
        int lca = LCA(i,l);
        if(i==lca) return i;

        for(int x:tree[lca].children){
            if(x<l && tree[x].pair > l) return x;
        }
        return -100;
    }
}